

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O0

void consume(void)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  int *piVar4;
  void *this;
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  native_handle_type local_18;
  _Optional_payload_base<int> local_10;
  optional<int> val;
  
  rtb::Concurrency::Queue<int>::subscribe(&q);
  while( true ) {
    local_10 = (_Optional_payload_base<int>)rtb::Concurrency::Queue<int>::pop(&q);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_10);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Consumer (id#");
    local_18 = (native_handle_type)std::this_thread::get_id();
    pbVar3 = std::operator<<(poVar2,(id)local_18);
    poVar2 = std::operator<<(pbVar3,"): ");
    piVar4 = std::optional<int>::value((optional<int> *)&local_10);
    this = (void *)std::ostream::operator<<(poVar2,*piVar4);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_24 = 0x14;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  }
  rtb::Concurrency::Queue<int>::unsubscribe(&q);
  return;
}

Assistant:

void consume() {
    // Important, you always need to subscribe to the `Queue` prior reading from it
    q.subscribe();
    while (auto val{ q.pop() }) {
        cout << "Consumer (id#" << std::this_thread::get_id() << "): " << val.value() << endl;
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    // When no consumers are subscribet to the `Queue`, data is removed from the Queue and
    // no new data is added until a new consumer subscribes
    q.unsubscribe();
}